

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valcvt-base.h
# Opt level: O2

void __thiscall
mp::pre::ModelValues<mp::pre::ValueMap<mp::pre::ValueNode,_mp::pre::BasicValuePresolver_&>_>::
ModelValues(ModelValues<mp::pre::ValueMap<mp::pre::ValueNode,_mp::pre::BasicValuePresolver_&>_>
            *this,ParamType prm,string *nm)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string((string *)this,(string *)nm);
  ValueMap<mp::pre::ValueNode,_mp::pre::BasicValuePresolver_&>::ValueMap(&this->vars_,prm);
  ValueMap<mp::pre::ValueNode,_mp::pre::BasicValuePresolver_&>::ValueMap(&this->cons_,prm);
  ValueMap<mp::pre::ValueNode,_mp::pre::BasicValuePresolver_&>::ValueMap(&this->objs_,prm);
  this->p_extra_ = (void *)0x0;
  std::operator+(&local_50,nm,"_vars");
  std::__cxx11::string::operator=((string *)&(this->vars_).name_,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::operator+(&local_70,nm,"_cons");
  std::__cxx11::string::operator=((string *)&(this->cons_).name_,(string *)&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::operator+(&local_90,nm,"_objs");
  std::__cxx11::string::operator=((string *)&(this->objs_).name_,(string *)&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  return;
}

Assistant:

ModelValues(ParamType prm, const std::string& nm) :
      name_{nm}, vars_(prm), cons_(prm), objs_(prm) {
    vars_.SetName(nm+"_vars");
    cons_.SetName(nm+"_cons");
    objs_.SetName(nm+"_objs");
  }